

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O2

QTextStream * __thiscall QTextStream::operator>>(QTextStream *this,QByteArray *array)

{
  QTextStreamPrivate *pQVar1;
  qsizetype qVar2;
  Data *pDVar3;
  char *pcVar4;
  bool bVar5;
  long in_FS_OFFSET;
  QStringView local_68;
  qsizetype length;
  QChar *ptr;
  QMessageLogger local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d_ptr)._M_t.
           super___uniq_ptr_impl<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>._M_t.
           super__Tuple_impl<0UL,_QTextStreamPrivate_*,_std::default_delete<QTextStreamPrivate>_>.
           super__Head_base<0UL,_QTextStreamPrivate_*,_false>._M_head_impl;
  if ((pQVar1->string == (QString *)0x0) && (pQVar1->device == (QIODevice *)0x0)) {
    local_48.context.version = 2;
    local_48.context.function._4_4_ = 0;
    local_48.context.line = 0;
    local_48.context.file._0_4_ = 0;
    local_48.context.file._4_4_ = 0;
    local_48.context.function._0_4_ = 0;
    local_48.context.category = "default";
    QMessageLogger::warning(&local_48,"QTextStream: No device");
  }
  else {
    QTextStreamPrivate::scan(pQVar1,(QChar **)0x0,(qsizetype *)0x0,0,NotSpace);
    QTextStreamPrivate::consumeLastToken(pQVar1);
    ptr = (QChar *)&DAT_aaaaaaaaaaaaaaaa;
    length = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    bVar5 = QTextStreamPrivate::scan(pQVar1,&ptr,&length,0,Space);
    if (bVar5) {
      local_68.m_size = length;
      local_68.m_data = &ptr->ucs;
      QStringView::toUtf8((QByteArray *)&local_48,&local_68);
      pDVar3 = (array->d).d;
      pcVar4 = (array->d).ptr;
      (array->d).d = (Data *)CONCAT44(local_48.context.line,local_48.context.version);
      (array->d).ptr = (char *)CONCAT44(local_48.context.file._4_4_,local_48.context.file._0_4_);
      local_48.context.version = (int)pDVar3;
      local_48.context.line = (int)((ulong)pDVar3 >> 0x20);
      local_48.context.file._0_4_ = SUB84(pcVar4,0);
      local_48.context.file._4_4_ = (undefined4)((ulong)pcVar4 >> 0x20);
      qVar2 = (array->d).size;
      (array->d).size = CONCAT44(local_48.context.function._4_4_,local_48.context.function._0_4_);
      local_48.context.function._0_4_ = (undefined4)qVar2;
      local_48.context.function._4_4_ = (undefined4)((ulong)qVar2 >> 0x20);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_48);
      QTextStreamPrivate::consumeLastToken(pQVar1);
    }
    else {
      pQVar1 = (this->d_ptr)._M_t.
               super___uniq_ptr_impl<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>.
               _M_t.
               super__Tuple_impl<0UL,_QTextStreamPrivate_*,_std::default_delete<QTextStreamPrivate>_>
               .super__Head_base<0UL,_QTextStreamPrivate_*,_false>._M_head_impl;
      if (pQVar1->status == Ok) {
        pQVar1->status = ReadPastEnd;
      }
      QByteArray::clear(array);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QTextStream &QTextStream::operator>>(QByteArray &array)
{
    Q_D(QTextStream);
    CHECK_VALID_STREAM(*this);

    d->scan(nullptr, nullptr, 0, QTextStreamPrivate::NotSpace);
    d->consumeLastToken();

    const QChar *ptr;
    qsizetype length;
    if (!d->scan(&ptr, &length, 0, QTextStreamPrivate::Space)) {
        setStatus(ReadPastEnd);
        array.clear();
        return *this;
    }

    array = QStringView(ptr, length).toUtf8();

    d->consumeLastToken();
    return *this;
}